

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_flamestrike(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  int dam;
  CHAR_DATA *victim;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  
  dice(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
  damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (CHAR_DATA *)CONCAT44(in_EDI,in_ESI),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (int)((ulong)in_RCX >> 0x20),SUB81((ulong)in_RCX >> 0x18,0));
  return;
}

Assistant:

void spell_flamestrike(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(6 + level / 2, 8);

	if (saves_spell(level, victim, DAM_FIRE))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_FIRE, true);
}